

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O2

bool __thiscall Satyricon::SATSolver::solve(SATSolver *this)

{
  uint *puVar1;
  pointer pLVar2;
  uint uVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  ClausePtr conflict;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  uint local_44;
  Literal l;
  int backtrack_level;
  ulong local_38;
  
  if (0 < this->log_level) {
    poVar4 = std::operator<<((ostream *)&std::cout,"begin solve");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  lVar5 = (long)(this->clauses).
                super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->clauses).
                super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar10._8_4_ = (int)(lVar5 >> 0x23);
  auVar10._0_8_ = lVar6;
  auVar10._12_4_ = 0x45300000;
  uVar9 = (ulong)(((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) *
                 (this->param).initial_learn_mult);
  uVar3 = new_restart_threshold(this);
  (this->param).restart_threshold = uVar3;
  Literal_Heap::initialize(&(this->order).order);
  local_44 = 0;
  print_status(this,0,0,(uint)uVar9);
  local_38 = 100;
  uVar8 = 100;
  uVar3 = 0;
  while( true ) {
    while( true ) {
      if (1 < this->log_level) {
        poVar4 = std::operator<<((ostream *)&std::cout,"propagate at level ");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,(int)((ulong)((long)(this->trail_limit).
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->trail_limit).
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start) >> 2
                                        ));
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      conflict = propagation(this);
      if (conflict != (ClausePtr)0x0) break;
      if ((long)(this->trail).
                super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->trail).
                super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == (ulong)this->number_of_variable) {
        if (1 < this->log_level) {
          poVar4 = std::operator<<((ostream *)&std::cout,"assinged all literals without conflict");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        build_sat_proof(this);
        goto LAB_00112e8b;
      }
      if (((this->param).enable_deletion == true) &&
         ((uVar9 & 0xffffffff) <=
          (ulong)((long)(this->learned).
                        super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->learned).
                        super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3))) {
        reduce_learned(this);
      }
      if (((this->param).enable_restart == true) && ((this->param).restart_threshold <= uVar3)) {
        uVar7 = new_restart_threshold(this);
        puVar1 = &(this->param).restart_threshold;
        *puVar1 = *puVar1 + uVar7;
        if (1 < this->log_level) {
          poVar4 = std::operator<<((ostream *)&std::cout,"restarting. next restart at ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        local_44 = local_44 + 1;
        cancel_until(this,0);
      }
      l = choice_lit(this);
      if (1 < this->log_level) {
        poVar4 = std::operator<<((ostream *)&std::cout,"decide literal ");
        poVar4 = operator<<(poVar4,&l);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      assume(this,l);
    }
    uVar3 = uVar3 + 1;
    if ((int)((ulong)((long)(this->trail_limit).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->trail_limit).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 2) == 0) break;
    uVar7 = (int)uVar8 - 1;
    uVar8 = (ulong)uVar7;
    if (uVar7 == 0) {
      uVar8 = (ulong)((double)(local_38 & 0xffffffff) * 1.5);
      uVar7 = (uint)uVar9 +
              (int)(long)(((double)(uVar9 & 0xffffffff) * (this->param).percentual_learn_increase) /
                         100.0);
      uVar9 = (ulong)uVar7;
      print_status(this,uVar3,local_44,uVar7);
      local_38 = uVar8;
    }
    pLVar2 = (this->solve_conflict_literals).
             super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->solve_conflict_literals).
        super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish != pLVar2) {
      (this->solve_conflict_literals).
      super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = pLVar2;
    }
    conflict_analysis(this,conflict,&this->solve_conflict_literals,&backtrack_level);
    cancel_until(this,backtrack_level);
    learn_clause(this,&this->solve_conflict_literals);
    literals_activity_decay(this);
    clause_activity_decay(this);
  }
  if (1 < this->log_level) {
    poVar4 = std::operator<<((ostream *)&std::cout,"conflict at level 0, build unsat proof");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
LAB_00112e8b:
  print_status(this,uVar3,local_44,(uint)uVar9);
  return conflict == (ClausePtr)0x0;
}

Assistant:

bool SATSolver::solve() {
    // main method
    PRINT("begin solve" << endl);

    // initialize search parameter
    unsigned int conflict_counter = 0;
    unsigned int restart_counter = 0;
    unsigned int learn_limit = static_cast<unsigned int>(
            static_cast<double>(clauses.size())*param.initial_learn_mult );
    param.restart_threshold = new_restart_threshold();

    unsigned int increase_limit_threshold = 100;
    unsigned int increase_limit_counter = increase_limit_threshold;

    // order literal for decision
    order.initialize_heap();

    // preprocess
    if ( param.enable_preprocessing) { preprocessing(); }

    print_status(conflict_counter,restart_counter, learn_limit);
    while ( true ) { // loop until a solution is found

        PRINT_VERBOSE("propagate at level " << current_level() << endl);
        // propagate assingment effect
        ClausePtr conflict = propagation();

        if ( conflict != nullptr ) {

            conflict_counter++;

            // if a conflict is found on level 0, it is impossible to solve
            // so the formula must be unsatisfiable
            if ( current_level() == 0 ) {
                PRINT_VERBOSE("conflict at level 0, build unsat proof" << endl);
                print_status(conflict_counter,restart_counter, learn_limit);
                return false; // UNSAT
            }

            if ( --increase_limit_counter == 0 ) {
                increase_limit_threshold *= 1.5;
                increase_limit_counter = increase_limit_threshold;
                learn_limit += static_cast<unsigned int>(
                        (learn_limit*param.percentual_learn_increase)/100.0);

                print_status(conflict_counter,restart_counter, learn_limit);
            }
            // otherwise, analize the conflict and backtrack

            int backtrack_level;
            solve_conflict_literals.clear();
            conflict_analysis(conflict,solve_conflict_literals,backtrack_level);

            cancel_until( backtrack_level );
            learn_clause(solve_conflict_literals); // learn the conflcit clause

            // after a conflict, the activity of literals and clauses decay
            literals_activity_decay();
            clause_activity_decay();
        }
        else {
            // no conflict and no more value to propagate

            // if all variables are asigned, the problem is satisfiable
            if ( number_of_assigned_variable() == number_of_variable ) {
                PRINT_VERBOSE("assinged all literals without conflict" << endl);
                build_sat_proof();
                print_status(conflict_counter,restart_counter, learn_limit);
                return true; // SAT
            }

            if ( current_level() == 0 ) {
                //simplify(clauses);
                //simplify(learned);
            }

            // if the learning limit is reached, the learned clause must
            // be reduced, the new learning limit is now higher
            if ( param.enable_deletion && learned.size() >= learn_limit ) {
                // cast for suppres warning
                reduce_learned();
            }

            if ( param.enable_restart &&
                    conflict_counter >= param.restart_threshold ) {
                // if the restart limit is reached, bactrack to level zero
                // and select the new threshold for the restart process
                restart_counter++;
                param.restart_threshold += new_restart_threshold();
                PRINT_VERBOSE("restarting. next restart at "<<
                        param.restart_threshold<< endl);
                cancel_until(0);
            }

            // open a new decision level and decide a new literal
            // based on the vsids heuristic
            Literal l = choice_lit();
            PRINT_VERBOSE("decide literal " << l << endl);
            assume(l);
        }
    }
}